

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

quatf tinyusdz::to_quaternion(float3 *axis,float angle)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  quatf qVar9;
  undefined8 local_28;
  
  dVar1 = ((double)angle * 0.5) / 180.0;
  dVar2 = math::sin_pi_imp<double>(dVar1);
  if (0.25 <= ABS(dVar1)) {
    uVar4 = (undefined4)((ulong)-dVar1 >> 0x20);
    if (-dVar1 <= dVar1) {
      uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_28 = (double)CONCAT44(uVar4,SUB84(dVar1,0));
    dVar1 = floor((double)CONCAT44(uVar4,SUB84(dVar1,0)));
    local_28 = local_28 - dVar1;
    bVar3 = 0.5 < local_28;
    if (0.5 < local_28) {
      local_28 = 1.0 - local_28;
    }
    dVar7 = local_28 + -0.5;
    uVar4 = 0;
    uVar5 = 0;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar8 = ABS(local_28);
      if (dVar8 <= 0.5) {
        dVar8 = 0.5;
      }
      if (dVar8 * 0.0 < ABS(dVar7)) {
        if (local_28 <= 0.25) {
          dVar7 = cos(local_28 * 3.141592653589793);
          uVar4 = SUB84(dVar7,0);
          uVar5 = (uint)((ulong)dVar7 >> 0x20);
        }
        else {
          dVar7 = sin((0.5 - local_28) * 3.141592653589793);
          uVar4 = SUB84(dVar7,0);
          uVar5 = (uint)((ulong)dVar7 >> 0x20);
        }
        if (((bVar3 ^ (byte)(int)dVar1) & 1) != 0) {
          uVar5 = uVar5 ^ 0x80000000;
        }
      }
    }
  }
  else {
    dVar1 = cos(dVar1 * 3.141592653589793);
    uVar4 = SUB84(dVar1,0);
    uVar5 = (uint)((ulong)dVar1 >> 0x20);
  }
  fVar6 = (float)dVar2;
  qVar9.imag._M_elems[2] = fVar6 * axis->_M_elems[2];
  qVar9.imag._M_elems[0] = fVar6 * (float)*(undefined8 *)axis->_M_elems;
  qVar9.imag._M_elems[1] = fVar6 * (float)((ulong)*(undefined8 *)axis->_M_elems >> 0x20);
  qVar9.real = (float)(double)CONCAT44(uVar5,uVar4);
  return qVar9;
}

Assistant:

value::quatf to_quaternion(const value::float3 &axis, const float angle) {

  // Use sin_pi and cos_pi for better accuracy.
  float s = float(math::sin_pi(double(angle)/2.0/180.0));
  float c = float(math::cos_pi(double(angle)/2.0/180.0));

  value::quatf q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}